

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall
ThreadContext::UnregisterExpirableObject(ThreadContext *this,ExpirableObject *object)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void *pvVar4;
  void **ppvVar5;
  void *local_28;
  ExpirableObject **local_20;
  ExpirableObject **registrationData;
  ExpirableObject *object_local;
  ThreadContext *this_local;
  
  registrationData = (ExpirableObject **)object;
  object_local = (ExpirableObject *)this;
  if (this->expirableObjectList == (ExpirableObjectList *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbec,"(this->expirableObjectList)","this->expirableObjectList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pvVar4 = ExpirableObject::GetRegistrationHandle((ExpirableObject *)registrationData);
  if (pvVar4 == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbed,"(object->GetRegistrationHandle() != nullptr)",
                       "object->GetRegistrationHandle() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_28 = ExpirableObject::GetRegistrationHandle((ExpirableObject *)registrationData);
  ppvVar5 = Memory::PointerValue<void>(&local_28);
  local_20 = (ExpirableObject **)*ppvVar5;
  if (*local_20 != (ExpirableObject *)registrationData) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xbf0,"(*registrationData == object)","*registrationData == object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DListBase<ExpirableObject_*,_RealCount>::MoveElementTo
            (&this->expirableObjectList->super_DListBase<ExpirableObject_*,_RealCount>,local_20,
             &this->expirableObjectDisposeList->super_DListBase<ExpirableObject_*,_RealCount>);
  ExpirableObject::ClearRegistrationHandle((ExpirableObject *)registrationData);
  if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(ExpirableCollectPhase,L"Unregistered 0x%p\n",registrationData);
  }
  this->numExpirableObjects = this->numExpirableObjects + -1;
  return;
}

Assistant:

void
ThreadContext::UnregisterExpirableObject(ExpirableObject* object)
{
    Assert(this->expirableObjectList);
    Assert(object->GetRegistrationHandle() != nullptr);

    ExpirableObject** registrationData = (ExpirableObject**)PointerValue(object->GetRegistrationHandle());
    Assert(*registrationData == object);

    this->expirableObjectList->MoveElementTo(registrationData, this->expirableObjectDisposeList);
    object->ClearRegistrationHandle();
    OUTPUT_VERBOSE_TRACE(Js::ExpirableCollectPhase, _u("Unregistered 0x%p\n"), object);
    numExpirableObjects--;
}